

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlCharEncoding xmlParseCharEncoding(char *name)

{
  xmlCharEncoding xVar1;
  void *pvVar2;
  
  if (name == (char *)0x0) {
    return XML_CHAR_ENCODING_NONE;
  }
  pvVar2 = bsearch(name,xmlEncTable,0x25,0x10,xmlCompareEncTableEntries);
  if (pvVar2 == (void *)0x0) {
    xVar1 = XML_CHAR_ENCODING_ERROR;
  }
  else {
    xVar1 = XML_CHAR_ENCODING_UTF16LE;
    if (*(xmlCharEncoding *)((long)pvVar2 + 8) != XML_CHAR_ENCODING_UTF16) {
      xVar1 = *(xmlCharEncoding *)((long)pvVar2 + 8);
    }
  }
  return xVar1;
}

Assistant:

static xmlCharEncoding
xmlParseCharEncodingInternal(const char *name)
{
    const xmlEncTableEntry *entry;

    if (name == NULL)
       return(XML_CHAR_ENCODING_NONE);

    entry = bsearch(name, xmlEncTable,
                    sizeof(xmlEncTable) / sizeof(xmlEncTable[0]),
                    sizeof(xmlEncTable[0]), xmlCompareEncTableEntries);
    if (entry != NULL)
        return(entry->enc);

    return(XML_CHAR_ENCODING_ERROR);
}